

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O1

int __thiscall Fl_Window_Type::handle(Fl_Window_Type *this,int event)

{
  byte bVar1;
  int iVar2;
  Fl_Group *pFVar3;
  Fl_Type *pFVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Fl_Type *pFVar8;
  Fl_Menu_Item *pFVar9;
  int t_1;
  uint uVar10;
  Fl_Group *pFVar11;
  fd_set *pfVar12;
  int t;
  int iVar13;
  uint uVar14;
  fd_set *extraout_RDX;
  fd_set *__writefds;
  fd_set *__writefds_00;
  fd_set *extraout_RDX_00;
  fd_set *extraout_RDX_01;
  fd_set *extraout_RDX_02;
  fd_set *__writefds_01;
  int *__file;
  fd_set *pfVar15;
  Fl_Window_Type *pFVar16;
  timeval *in_R8;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  Fl_Widget_Type *myo;
  Fl_Window_Type *pFVar22;
  Fl_Window_Type *pFVar23;
  bool bVar24;
  undefined4 extraout_var;
  
  iVar7 = Fl::e_state;
  iVar6 = Fl::e_x;
  uVar14 = 0;
  __file = (int *)(ulong)(event - 1U);
  if (0xb < event - 1U) {
    return 0;
  }
  pFVar11 = (Fl_Group *)
            ((long)&switchD_0018c7ee::switchdataD_00214158 +
            (long)(int)(&switchD_0018c7ee::switchdataD_00214158)[(long)__file]);
  switch(__file) {
  case (int *)0x0:
    this->mx = Fl::e_x;
    this->x1 = iVar6;
    iVar7 = Fl::e_y;
    this->my = Fl::e_y;
    this->y1 = iVar7;
    this->dx = 0;
    this->dy = 0;
    this->drag = 0;
    if (Fl::e_keysym < 0xfeeb) {
      handle::selection = (Fl_Type *)this;
      for (pFVar8 = (this->super_Fl_Widget_Type).super_Fl_Type.next;
          (pFVar8 != (Fl_Type *)0x0 &&
          ((this->super_Fl_Widget_Type).super_Fl_Type.level < pFVar8->level)); pFVar8 = pFVar8->next
          ) {
        iVar6 = (*pFVar8->_vptr_Fl_Type[0x17])(pFVar8);
        if ((iVar6 != 0) && (iVar6 = (*pFVar8->_vptr_Fl_Type[0x1e])(pFVar8), iVar6 == 0)) {
          pFVar3 = (Fl_Group *)pFVar8[1].prev;
          bVar24 = pFVar3 == (Fl_Group *)0x0;
          if (!bVar24) {
            bVar1 = (byte)(pFVar3->super_Fl_Widget).flags_;
            pFVar11 = pFVar3;
            while ((bVar1 & 2) == 0) {
              pFVar11 = (pFVar11->super_Fl_Widget).parent_;
              bVar24 = pFVar11 == (Fl_Group *)0x0;
              if (bVar24) goto LAB_0018ca45;
              bVar1 = (byte)(pFVar11->super_Fl_Widget).flags_;
            }
            if (!bVar24) goto LAB_0018ca0c;
          }
LAB_0018ca45:
          iVar6 = Fl::event_inside((Fl_Widget *)pFVar3);
          if ((iVar6 != 0) && (handle::selection = pFVar8, Fl::e_clicks == 1)) {
            reveal_in_browser(pFVar8);
          }
        }
LAB_0018ca0c:
      }
      if ((this->numselected != 0) && ((Fl::e_state & 0x10000U) == 0)) {
        iVar6 = this->mx;
        iVar7 = this->br;
        if (iVar6 <= snap + iVar7) {
          uVar14 = this->bx;
          in_R8 = (timeval *)(ulong)uVar14;
          if ((int)(uVar14 - snap) <= iVar6) {
            iVar2 = this->my;
            uVar10 = this->bt;
            pFVar11 = (Fl_Group *)(ulong)uVar10;
            if ((iVar2 <= (int)(uVar10 + snap)) && (iVar13 = this->by, iVar13 - snap <= iVar2)) {
              iVar17 = 5;
              if (5 < snap) {
                iVar17 = snap;
              }
              iVar19 = iVar7 - uVar14;
              iVar18 = iVar19 + 3;
              if (-1 < iVar19) {
                iVar18 = iVar19;
              }
              iVar19 = iVar18 >> 2;
              if (iVar17 <= iVar18 >> 2) {
                iVar19 = iVar17;
              }
              uVar20 = 2;
              if ((iVar7 - iVar19 <= iVar6) || (uVar20 = 1, iVar6 < (int)(iVar19 + uVar14))) {
                this->drag = this->drag | uVar20;
              }
              iVar7 = uVar10 - iVar13;
              iVar6 = iVar7 + 3;
              if (-1 < iVar7) {
                iVar6 = iVar7;
              }
              iVar7 = iVar6 >> 2;
              if (iVar17 <= iVar6 >> 2) {
                iVar7 = iVar17;
              }
              uVar14 = 8;
              if (iVar13 + iVar7 < iVar2) {
                pFVar11 = (Fl_Group *)(ulong)(uVar10 - iVar7);
                uVar14 = 4;
                if ((int)(uVar10 - iVar7) < iVar2) goto LAB_0018cb5f;
              }
              else {
LAB_0018cb5f:
                this->drag = this->drag | uVar14;
              }
              if (this->drag == 0) {
                this->drag = 0x10;
              }
            }
          }
        }
      }
      iVar6 = (*handle::selection->_vptr_Fl_Type[7])
                        (handle::selection,(ulong)(uint)this->mx,(ulong)(uint)this->my);
      pFVar8 = (Fl_Type *)CONCAT44(extraout_var,iVar6);
      if (pFVar8 == (Fl_Type *)0x0) {
        if (this->drag != 0) {
          return 1;
        }
        this->drag = 0x20;
        return 1;
      }
      if ((Fl::e_state & 0x10000U) == 0) {
        deselect();
        select(iVar6,(fd_set *)&DAT_00000001,__writefds_00,(fd_set *)pFVar11,in_R8);
        iVar6 = (*pFVar8->_vptr_Fl_Type[0x1e])(pFVar8);
        if (iVar6 != 0) {
          (*pFVar8->_vptr_Fl_Type[0xb])(pFVar8);
        }
      }
      else {
        Fl::e_is_click = 0;
        select(iVar6,(fd_set *)(ulong)(pFVar8->selected == '\0'),__writefds,(fd_set *)pFVar11,in_R8)
        ;
      }
      handle::selection = pFVar8;
      this->drag = 0;
    }
    else {
      in_this_only = (Fl_Type *)this;
      pFVar9 = Fl_Menu_Item::popup(New_Menu,iVar6,iVar7,"New",handle::myprev,(Fl_Menu_ *)0x0);
      if ((pFVar9 != (Fl_Menu_Item *)0x0) && (pFVar9->callback_ != (Fl_Callback *)0x0)) {
        handle::myprev = pFVar9;
        (*pFVar9->callback_)((this->super_Fl_Widget_Type).o,pFVar9->user_data_);
      }
      in_this_only = (Fl_Type *)0x0;
    }
    break;
  case (int *)0x1:
    if (this->drag == 0) {
      return 0;
    }
    this->mx = Fl::e_x;
    iVar7 = Fl::e_y;
    this->my = Fl::e_y;
    iVar2 = Fl::e_state;
    if (this->drag == 0x20) {
LAB_0018c925:
      iVar13 = 0x2a078c;
      if ((Fl::e_clicks == 0) && (iVar13 = 0x2a0788, ((uint)Fl::e_state >> 0x12 & 1) == 0)) {
        uVar14 = this->x1;
        pfVar12 = (fd_set *)(ulong)uVar14;
        if (iVar6 < (int)uVar14) {
          this->x1 = iVar6;
          this->mx = uVar14;
        }
        uVar14 = this->y1;
        pFVar11 = (Fl_Group *)(ulong)uVar14;
        if (iVar7 < (int)uVar14) {
          this->y1 = iVar7;
          this->my = uVar14;
        }
        if (((uint)iVar2 >> 0x10 & 1) == 0) {
          deselect();
          pfVar12 = extraout_RDX;
        }
        else {
          Fl::e_is_click = 0;
        }
        pFVar8 = (this->super_Fl_Widget_Type).super_Fl_Type.next;
        if (pFVar8 != (Fl_Type *)0x0) {
          iVar6 = 0;
          do {
            if (pFVar8->level <= (this->super_Fl_Widget_Type).super_Fl_Type.level) break;
            iVar7 = (*pFVar8->_vptr_Fl_Type[0x17])(pFVar8);
            pfVar12 = extraout_RDX_00;
            if ((iVar7 != 0) &&
               (iVar7 = (*pFVar8->_vptr_Fl_Type[0x1e])(pFVar8), pfVar12 = extraout_RDX_01,
               iVar7 == 0)) {
              pFVar3 = (Fl_Group *)pFVar8[1].prev;
              bVar24 = pFVar3 == (Fl_Group *)0x0;
              if (!bVar24) {
                bVar1 = (byte)(pFVar3->super_Fl_Widget).flags_;
                pFVar11 = pFVar3;
                while ((bVar1 & 2) == 0) {
                  pFVar11 = (pFVar11->super_Fl_Widget).parent_;
                  bVar24 = pFVar11 == (Fl_Group *)0x0;
                  if (bVar24) goto LAB_0018ce61;
                  bVar1 = (byte)(pFVar11->super_Fl_Widget).flags_;
                }
                if (!bVar24) goto LAB_0018ce25;
              }
LAB_0018ce61:
              iVar7 = Fl::event_inside((Fl_Widget *)pFVar3);
              if (iVar7 != 0) {
                handle::selection = pFVar8;
              }
              pFVar4 = pFVar8[1].prev;
              uVar14 = *(uint *)&pFVar4->user_data_;
              pfVar12 = (fd_set *)(ulong)uVar14;
              if (this->x1 <= (int)uVar14) {
                uVar10 = *(uint *)((long)&pFVar4->user_data_ + 4);
                pFVar11 = (Fl_Group *)(ulong)uVar10;
                if (((this->y1 < (int)uVar10) &&
                    (uVar14 = uVar14 + *(int *)&pFVar4->user_data_type_,
                    pfVar12 = (fd_set *)(ulong)uVar14, (int)uVar14 < this->mx)) &&
                   (uVar10 = uVar10 + *(int *)((long)&pFVar4->user_data_type_ + 4),
                   pFVar11 = (Fl_Group *)(ulong)uVar10, (int)uVar10 < this->my)) {
                  pfVar15 = (fd_set *)&DAT_00000001;
                  if (((uint)iVar2 >> 0x10 & 1) != 0) {
                    pfVar15 = (fd_set *)(ulong)(pFVar8->selected == '\0');
                  }
                  iVar6 = iVar6 + 1;
                  select((int)pFVar8,pfVar15,pfVar12,(fd_set *)pFVar11,in_R8);
                  pfVar12 = extraout_RDX_02;
                }
              }
            }
LAB_0018ce25:
            pFVar8 = pFVar8->next;
          } while (pFVar8 != (Fl_Type *)0x0);
          if (iVar6 != 0) goto LAB_0018cc22;
        }
        pfVar15 = (fd_set *)&DAT_00000001;
        if (((uint)iVar2 >> 0x10 & 1) != 0) {
          pfVar15 = (fd_set *)(ulong)(handle::selection->selected == '\0');
        }
        select((int)handle::selection,pfVar15,pfVar12,(fd_set *)pFVar11,in_R8);
      }
      else {
        Fl_Widget_Type::open(&this->super_Fl_Widget_Type,(char *)__file,iVar13);
      }
    }
    else {
      bVar24 = this->dy == 0;
      bVar5 = this->dx == 0;
      if ((bVar24 && bVar5) && (__file = &Fl::e_is_click, Fl::e_is_click != 0)) goto LAB_0018c925;
      if (!bVar24 || !bVar5) {
        moveallchildren(this);
      }
    }
LAB_0018cc22:
    this->drag = 0;
    Fl_Overlay_Window::redraw_overlay((Fl_Overlay_Window *)(this->super_Fl_Widget_Type).o);
    break;
  default:
    goto switchD_0018c7ee_caseD_2;
  case (int *)0x4:
    if (this->drag == 0) {
      return 0;
    }
    this->mx = Fl::e_x;
    this->my = Fl::e_y;
    newdx(this);
    break;
  case (int *)0x7:
    pfVar12 = (fd_set *)(ulong)(uint)Fl::e_keysym;
    bVar24 = false;
    iVar6 = 0;
    if (Fl::e_keysym < 0xff51) {
      if (Fl::e_keysym == 0x6f) {
        toggle_overlays((Fl_Widget *)this,__file);
        bVar24 = true;
        uVar14 = 0;
      }
      else {
        if (Fl::e_keysym == 0xff09) {
          pFVar22 = (Fl_Window_Type *)Fl_Type::current;
          if (Fl_Type::current != (Fl_Type *)0x0) {
            do {
              iVar6 = (*(pFVar22->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x17])(pFVar22);
              if ((iVar6 != 0) &&
                 (iVar6 = (*(pFVar22->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x1e])
                                    (pFVar22), pFVar16 = pFVar22, iVar6 == 0)) goto LAB_0018cefc;
              pFVar22 = (Fl_Window_Type *)(pFVar22->super_Fl_Widget_Type).super_Fl_Type.parent;
            } while (pFVar22 != (Fl_Window_Type *)0x0);
          }
          goto switchD_0018c9bc_default;
        }
        uVar14 = 0;
        if (Fl::e_keysym == 0xff1b) {
          (*((this->super_Fl_Widget_Type).o)->_vptr_Fl_Widget[6])();
          goto LAB_0018cd3a;
        }
      }
      goto LAB_0018cd88;
    }
    switch(Fl::e_keysym) {
    case 0xff51:
      iVar7 = -1;
      break;
    case 0xff52:
      iVar6 = -1;
      goto LAB_0018ccc3;
    case 0xff53:
      iVar7 = 1;
      iVar6 = 0;
      break;
    case 0xff54:
      iVar6 = 1;
LAB_0018ccc3:
      iVar7 = 0;
      break;
    default:
switchD_0018c9bc_default:
      bVar24 = false;
      uVar14 = 0;
      goto LAB_0018cd88;
    }
    this->dx = iVar7;
    this->dy = iVar6;
    iVar6 = Fl::e_state;
    iVar7 = 10;
    if (((uint)Fl::e_state >> 0x10 & 1) == 0) {
      iVar7 = 0x10;
    }
    this->drag = iVar7;
    if (((uint)iVar6 >> 0x12 & 1) != 0) {
      this->dx = this->dx * gridx;
      this->dy = this->dy * gridy;
    }
    moveallchildren(this);
    this->drag = 0;
LAB_0018cd3a:
    bVar24 = false;
    uVar14 = 1;
LAB_0018cd88:
    if (bVar24) {
switchD_0018c7ee_caseD_b:
      in_this_only = (Fl_Type *)this;
      pFVar9 = Fl_Menu_Item::test_shortcut(Main_Menu);
      if ((pFVar9 != (Fl_Menu_Item *)0x0) && (pFVar9->callback_ != (Fl_Callback *)0x0)) {
        (*pFVar9->callback_)((this->super_Fl_Widget_Type).o,pFVar9->user_data_);
      }
      uVar14 = (uint)(pFVar9 != (Fl_Menu_Item *)0x0);
      in_this_only = (Fl_Type *)0x0;
    }
    goto switchD_0018c7ee_caseD_2;
  case (int *)0xb:
    goto switchD_0018c7ee_caseD_b;
  }
  uVar14 = 1;
switchD_0018c7ee_caseD_2:
  return uVar14;
  while (pFVar16 != this) {
LAB_0018cefc:
    pFVar16 = (Fl_Window_Type *)(pFVar16->super_Fl_Widget_Type).super_Fl_Type.parent;
    if (pFVar16 == (Fl_Window_Type *)0x0) break;
  }
  if ((pFVar16 == (Fl_Window_Type *)0x0) ||
     (iVar6 = (*(pFVar16->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x17])(), iVar6 == 0)) {
    pFVar22 = (Fl_Window_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.next;
    if (pFVar22 == (Fl_Window_Type *)0x0) goto switchD_0018c9bc_default;
    uVar10 = (pFVar22->super_Fl_Widget_Type).super_Fl_Type.level;
    pfVar12 = (fd_set *)(ulong)uVar10;
    bVar24 = false;
    uVar14 = 0;
    if ((int)uVar10 <= (this->super_Fl_Widget_Type).super_Fl_Type.level) goto LAB_0018cd88;
  }
  uVar21 = (ulong)((uint)iVar7 >> 0xd & 8);
  pFVar16 = *(Fl_Window_Type **)
             ((long)(pFVar22->super_Fl_Widget_Type).extra_code_ + (uVar21 - 0x28));
  pFVar23 = pFVar22;
  if (pFVar16 != (Fl_Window_Type *)0x0) {
    while (pFVar23 = pFVar22,
          (this->super_Fl_Widget_Type).super_Fl_Type.level <
          (pFVar16->super_Fl_Widget_Type).super_Fl_Type.level) {
      iVar6 = (*(pFVar16->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x17])(pFVar16);
      if (((iVar6 != 0) &&
          (iVar6 = (*(pFVar16->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x1e])(pFVar16),
          pFVar23 = pFVar16, iVar6 == 0)) ||
         (pFVar16 = *(Fl_Window_Type **)
                     ((long)(pFVar16->super_Fl_Widget_Type).extra_code_ + ((uVar21 | 0x50) - 0x78)),
         pFVar23 = pFVar22, pFVar16 == (Fl_Window_Type *)0x0)) break;
    }
  }
  deselect();
  select((int)pFVar23,(fd_set *)&DAT_00000001,__writefds_01,pfVar12,in_R8);
  goto LAB_0018cd3a;
}

Assistant:

int Fl_Window_Type::handle(int event) {
  static Fl_Type* selection;
  switch (event) {
  case FL_PUSH:
    x1 = mx = Fl::event_x();
    y1 = my = Fl::event_y();
    drag = dx = dy = 0;
    // test for popup menu:
    if (Fl::event_button() >= 3) {
      in_this_only = this; // modifies how some menu items work.
      static const Fl_Menu_Item* myprev;
      const Fl_Menu_Item* m = New_Menu->popup(mx,my,"New",myprev);
      if (m && m->callback()) {myprev = m; m->do_callback(this->o);}
      in_this_only = 0;
      return 1;
    }
    // find the innermost item clicked on:
    selection = this;
    {for (Fl_Type* i=next; i && i->level>level; i=i->next)
      if (i->is_widget() && !i->is_menu_item()) {
      Fl_Widget_Type* myo = (Fl_Widget_Type*)i;
      for (Fl_Widget *o1 = myo->o; o1; o1 = o1->parent())
	if (!o1->visible()) goto CONTINUE2;
      if (Fl::event_inside(myo->o)) {
        selection = myo;
        if (Fl::event_clicks()==1)
          reveal_in_browser(myo);
      }
    CONTINUE2:;
    }}
    // see if user grabs edges of selected region:
    if (numselected && !(Fl::event_state(FL_SHIFT)) &&
	mx<=br+snap && mx>=bx-snap && my<=bt+snap && my>=by-snap) {
      int snap1 = snap>5 ? snap : 5;
      int w1 = (br-bx)/4; if (w1 > snap1) w1 = snap1;
      if (mx>=br-w1) drag |= RIGHT;
      else if (mx<bx+w1) drag |= LEFT;
      w1 = (bt-by)/4; if (w1 > snap1) w1 = snap1;
      if (my<=by+w1) drag |= TOP;
      else if (my>bt-w1) drag |= BOTTOM;
      if (!drag) drag = DRAG;
    }
    // do object-specific selection of other objects:
    {Fl_Type* t = selection->click_test(mx, my);
    if (t) {
      //if (t == selection) return 1; // indicates mouse eaten w/o change
      if (Fl::event_state(FL_SHIFT)) {
	Fl::event_is_click(0);
	select(t, !t->selected);
      } else {
	deselect();
	select(t, 1);
	if (t->is_menu_item()) t->open();
      }
      selection = t;
      drag = 0;
    } else {
      if (!drag) drag = BOX; // if all else fails, start a new selection region
    }}
    return 1;

  case FL_DRAG:
    if (!drag) return 0;
    mx = Fl::event_x();
    my = Fl::event_y();
    newdx();
    return 1;

  case FL_RELEASE:
    if (!drag) return 0;
    mx = Fl::event_x();
    my = Fl::event_y();
    if (drag != BOX && (dx || dy || !Fl::event_is_click())) {
      if (dx || dy) moveallchildren();
    } else if ((Fl::event_clicks() || Fl::event_state(FL_CTRL))) {
      Fl_Widget_Type::open();
    } else {
      if (mx<x1) {int t = x1; x1 = mx; mx = t;}
      if (my<y1) {int t = y1; y1 = my; my = t;}
      int n = 0;
      int toggle = Fl::event_state(FL_SHIFT);
      // clear selection on everything:
      if (!toggle) deselect(); else Fl::event_is_click(0);
      // select everything in box:
      for (Fl_Type*i=next; i&&i->level>level; i=i->next)
	if (i->is_widget() && !i->is_menu_item()) {
	Fl_Widget_Type* myo = (Fl_Widget_Type*)i;
	for (Fl_Widget *o1 = myo->o; o1; o1 = o1->parent())
	  if (!o1->visible()) goto CONTINUE;
	if (Fl::event_inside(myo->o)) selection = myo;
	if (myo->o->x()>=x1 && myo->o->y()>y1 &&
	    myo->o->x()+myo->o->w()<mx && myo->o->y()+myo->o->h()<my) {
	  n++;
	  select(myo, toggle ? !myo->selected : 1);
	}
      CONTINUE:;
      }
      // if nothing in box, select what was clicked on:
      if (!n) {
	select(selection, toggle ? !selection->selected : 1);
      }
    }
    drag = 0;
    ((Overlay_Window *)o)->redraw_overlay();
    return 1;

  case FL_KEYBOARD: {

    int backtab = 0;
    switch (Fl::event_key()) {

    case FL_Escape:
      ((Fl_Window*)o)->hide();
      return 1;

    case FL_Tab: {
      if (Fl::event_state(FL_SHIFT)) backtab = 1;
      // find current child:
      Fl_Type *i = Fl_Type::current;
      while (i && (!i->is_widget() || i->is_menu_item())) i = i->parent;
      if (!i) return 0;
      Fl_Type *p = i->parent;
      while (p && p != this) p = p->parent;
      if (!p || !p->is_widget()) {
	i = next; if (!i || i->level <= level) return 0;
      }
      p = i;
      for (;;) {
	i = backtab ? i->prev : i->next;
	if (!i || i->level <= level) {i = p; break;}
	if (i->is_widget() && !i->is_menu_item()) break;
      }
      deselect(); select(i,1);
      return 1;}

    case FL_Left:  dx = -1; dy = 0; goto ARROW;
    case FL_Right: dx = +1; dy = 0; goto ARROW;
    case FL_Up:    dx = 0; dy = -1; goto ARROW;
    case FL_Down:  dx = 0; dy = +1; goto ARROW;
    ARROW:
      // for some reason BOTTOM/TOP are swapped... should be fixed...
      drag = (Fl::event_state(FL_SHIFT)) ? (RIGHT|TOP) : DRAG;
      if (Fl::event_state(FL_CTRL)) {dx *= gridx; dy *= gridy;}
      moveallchildren();
      drag = 0;
      return 1;

    case 'o':
      toggle_overlays(0, 0);
      break;

    default:
      return 0;
    }}

  case FL_SHORTCUT: {
    in_this_only = this; // modifies how some menu items work.
    const Fl_Menu_Item* m = Main_Menu->test_shortcut();
    if (m && m->callback()) m->do_callback(this->o);
    in_this_only = 0;
    return (m != 0);}

  default:
    return 0;
  }
}